

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_sin>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [24];
  undefined1 auVar69 [24];
  long *in_RDI;
  float fVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_sin op;
  Mat *m;
  __m256 y2;
  __m256 z;
  __m256 poly_mask;
  __m256 swap_sign_bit;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m128i imm2_2;
  __m128i imm2_1;
  __m128i imm0_2;
  __m128i imm0_1;
  __m256i imm2;
  __m256i imm0;
  __m256 y;
  __m256 sign_bit;
  __m256 xmm3;
  __m256 xmm2;
  __m256 xmm1;
  v4sf y2_1;
  v4sf z_1;
  v4sf poly_mask_1;
  v4sf swap_sign_bit_1;
  v4si emm2;
  v4si emm0;
  v4sf y_1;
  v4sf sign_bit_1;
  v4sf xmm3_1;
  v4sf xmm2_1;
  v4sf xmm1_1;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  int local_13fc;
  undefined8 local_13f8;
  undefined8 local_13f0;
  undefined8 local_13e8;
  undefined4 local_13e0;
  long local_13d8;
  undefined4 local_13d0;
  undefined4 local_13cc;
  undefined4 local_13c8;
  undefined4 local_13c4;
  undefined4 local_13c0;
  undefined8 local_13b8;
  undefined1 (*local_13b0) [32];
  int local_13a8;
  int local_13a4;
  int local_13a0;
  int local_139c;
  int local_1398;
  int local_1394;
  int local_1390;
  undefined1 local_1389 [9];
  long *local_1380;
  undefined1 local_1375;
  int local_1374;
  undefined8 *local_1368;
  undefined8 *local_1360;
  undefined8 *local_1350;
  undefined1 (*local_1348) [32];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 (*local_1310) [32];
  undefined1 (*local_1308) [32];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined1 (*local_12f0) [32];
  long local_12e8;
  undefined4 local_12dc;
  long local_12d8;
  undefined1 (*local_12d0) [32];
  undefined4 local_12c4;
  int local_12c0;
  int local_12bc;
  undefined8 *local_12b8;
  undefined4 local_12ac;
  long local_12a8;
  undefined8 *local_1298;
  undefined8 *local_1270;
  undefined1 *local_1268;
  undefined8 *local_1260;
  undefined1 *local_1258;
  undefined1 (*local_1250) [32];
  undefined1 *local_1248;
  undefined1 local_1240 [8];
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  int local_1160;
  int iStack_115c;
  int iStack_1158;
  int iStack_1154;
  int iStack_1150;
  int iStack_114c;
  int iStack_1148;
  int iStack_1144;
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined1 local_10c0 [8];
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined1 local_1020 [32];
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [32];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined1 *local_d98;
  undefined1 *local_d90;
  undefined1 *local_d88;
  float *local_d80;
  float *local_d78;
  undefined1 *local_d70;
  float *local_d68;
  float *local_d60;
  undefined1 *local_d58;
  float *local_d50;
  float *local_d48;
  undefined1 *local_d40;
  float *local_d38;
  float *local_d30;
  undefined1 *local_d28;
  undefined1 *local_d20;
  undefined8 *local_d18;
  undefined1 *local_d10;
  undefined1 *local_d08;
  undefined8 *local_d00;
  undefined1 *local_cf8;
  undefined1 *local_cf0;
  undefined8 *local_ce8;
  undefined1 *local_ce0;
  undefined1 *local_cd8;
  float *local_cd0;
  float *local_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  float local_b00 [2];
  float afStack_af8 [2];
  float afStack_af0 [2];
  float afStack_ae8 [2];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_aa0 [2];
  float afStack_a98 [2];
  float afStack_a90 [2];
  float afStack_a88 [2];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  float local_a40 [2];
  float afStack_a38 [2];
  float afStack_a30 [2];
  float afStack_a28 [2];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float local_9e0 [2];
  float afStack_9d8 [2];
  float afStack_9d0 [2];
  float afStack_9c8 [2];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  float local_900 [2];
  float afStack_8f8 [2];
  float afStack_8f0 [2];
  float afStack_8e8 [2];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined4 local_874;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined4 local_854;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  ulong uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  ulong uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined8 local_620;
  undefined8 uStack_618;
  ulong local_610;
  ulong uStack_608;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  ulong local_5d0;
  ulong uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined1 local_590 [16];
  undefined8 local_580;
  undefined8 uStack_578;
  ulong local_570;
  ulong uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined4 local_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 *local_3a8;
  float *local_3a0;
  float *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  float *local_378;
  float *local_370;
  undefined1 *local_368;
  float *local_360;
  float *local_358;
  undefined1 *local_350;
  float *local_348;
  float *local_340;
  undefined1 *local_338;
  float *local_330;
  float *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined8 *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  undefined8 *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined8 *local_2e0;
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  float local_2c0 [2];
  float afStack_2b8 [2];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210 [2];
  float afStack_208 [2];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1b0 [2];
  float afStack_1a8 [2];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_180 [2];
  float afStack_178 [2];
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  ulong uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [16];
  ulong local_90;
  ulong uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ulong local_70;
  ulong uStack_68;
  ulong local_60;
  ulong uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40 [16];
  
  local_1390 = *(int *)((long)in_RDI + 0x2c);
  local_1394 = (int)in_RDI[6];
  local_1398 = *(int *)((long)in_RDI + 0x34);
  local_139c = (int)in_RDI[7];
  local_13a0 = (int)in_RDI[3];
  local_13a4 = local_1390 * local_1394 * local_1398 * local_13a0;
  local_1380 = in_RDI;
  for (local_13a8 = 0; local_13a8 < local_139c; local_13a8 = local_13a8 + 1) {
    local_1368 = &local_13f8;
    local_12bc = *(int *)((long)local_1380 + 0x2c);
    local_12c0 = (int)local_1380[6];
    local_12c4 = *(undefined4 *)((long)local_1380 + 0x34);
    local_12d0 = (undefined1 (*) [32])
                 (*local_1380 + local_1380[8] * (long)local_13a8 * local_1380[2]);
    local_12d8 = local_1380[2];
    local_12dc = (undefined4)local_1380[3];
    local_12e8 = local_1380[4];
    local_12b8 = &local_13f8;
    local_12a8 = (long)local_12bc * (long)local_12c0 * local_12d8;
    local_1360 = &local_13f8;
    local_1350 = &local_13f8;
    local_12ac = 0x10;
    local_1374 = local_13a8;
    local_1375 = 1;
    local_13f8 = 0;
    local_13e8 = 0;
    local_13e0 = 0;
    local_13d0 = 0;
    local_13cc = 0;
    local_13c8 = 0;
    local_13c4 = 0;
    local_13c0 = 0;
    local_13b8 = 0;
    local_13f0 = 0;
    local_13b0 = local_12d0;
    for (local_13fc = 0; local_13fc + 7 < local_13a4; local_13fc = local_13fc + 8) {
      local_1348 = local_13b0;
      uStack_f50 = *(undefined8 *)(*local_13b0 + 0x10);
      uStack_f48 = *(undefined8 *)(*local_13b0 + 0x18);
      local_1268 = local_1389;
      local_1270 = &local_1420;
      local_f00 = ZEXT832(0) << 0x20;
      local_1020._0_8_ = SUB168(*(undefined1 (*) [16])*local_13b0,0);
      local_1020._8_8_ = SUB168(*(undefined1 (*) [16])*local_13b0,8);
      local_f20 = local_1020._0_8_;
      uStack_f18 = local_1020._8_8_;
      local_f40 = 0x7fffffff7fffffff;
      uStack_f38 = 0x7fffffff7fffffff;
      uStack_f30 = 0x7fffffff7fffffff;
      uStack_f28 = 0x7fffffff7fffffff;
      auVar27._8_8_ = 0x7fffffff7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._16_8_ = 0x7fffffff7fffffff;
      auVar27._24_8_ = 0x7fffffff7fffffff;
      auVar1 = vandps_avx(*local_13b0,auVar27);
      local_f60 = local_1020._0_8_;
      uStack_f58 = local_1020._8_8_;
      local_f80 = 0x8000000080000000;
      uStack_f78 = 0x8000000080000000;
      uStack_f70 = 0x8000000080000000;
      uStack_f68 = 0x8000000080000000;
      auVar3._8_8_ = 0x8000000080000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._16_8_ = 0x8000000080000000;
      auVar3._24_8_ = 0x8000000080000000;
      auVar2 = vandps_avx(*local_13b0,auVar3);
      local_1020._0_8_ = auVar1._0_8_;
      uVar9 = local_1020._0_8_;
      local_1020._8_8_ = auVar1._8_8_;
      uVar10 = local_1020._8_8_;
      local_1020._16_8_ = auVar1._16_8_;
      uVar11 = local_1020._16_8_;
      local_1020._24_8_ = auVar1._24_8_;
      uVar12 = local_1020._24_8_;
      local_de0 = 0x3fa2f9833fa2f983;
      uStack_dd8 = 0x3fa2f9833fa2f983;
      uStack_dd0 = 0x3fa2f9833fa2f983;
      uStack_dc8 = 0x3fa2f9833fa2f983;
      local_dc0._0_4_ = auVar1._0_4_;
      local_dc0._4_4_ = auVar1._4_4_;
      uStack_db8._0_4_ = auVar1._8_4_;
      uStack_db8._4_4_ = auVar1._12_4_;
      uStack_db0._0_4_ = auVar1._16_4_;
      uStack_db0._4_4_ = auVar1._20_4_;
      uStack_da8._0_4_ = auVar1._24_4_;
      uStack_da8._4_4_ = auVar1._28_4_;
      local_10c0._4_4_ = local_dc0._4_4_ * 1.2732395;
      local_10c0._0_4_ = (float)local_dc0 * 1.2732395;
      uStack_10b8._0_4_ = (float)uStack_db8 * 1.2732395;
      uStack_10b8._4_4_ = uStack_db8._4_4_ * 1.2732395;
      uStack_10b0._0_4_ = (float)uStack_db0 * 1.2732395;
      uStack_10b0._4_4_ = uStack_db0._4_4_ * 1.2732395;
      auVar68 = _local_10c0;
      uStack_10a8._0_4_ = (float)uStack_da8 * 1.2732395;
      uStack_10a8._4_4_ = uStack_da8._4_4_;
      auVar3 = _local_10c0;
      local_c40 = local_10c0;
      uStack_c38 = uStack_10b8;
      uStack_10b0 = auVar68._16_8_;
      uStack_c30 = uStack_10b0;
      uStack_10a8 = auVar3._24_8_;
      uStack_c28 = uStack_10a8;
      local_1160 = (int)((float)local_dc0 * 1.2732395);
      iStack_115c = (int)(local_dc0._4_4_ * 1.2732395);
      iStack_1158 = (int)((float)uStack_db8 * 1.2732395);
      iStack_1154 = (int)(uStack_db8._4_4_ * 1.2732395);
      iStack_1150 = (int)((float)uStack_db0 * 1.2732395);
      iStack_114c = (int)(uStack_db0._4_4_ * 1.2732395);
      iStack_1148 = (int)((float)uStack_da8 * 1.2732395);
      iStack_1144 = (int)uStack_da8._4_4_;
      local_890 = CONCAT44(iStack_115c,local_1160);
      uStack_888 = CONCAT44(iStack_1154,iStack_1158);
      local_8b0 = CONCAT44(iStack_114c,iStack_1150);
      uStack_8a8 = CONCAT44(iStack_1144,iStack_1148);
      local_8c0 = 0x100000001;
      uStack_8b8 = 0x100000001;
      auVar7._8_8_ = uStack_888;
      auVar7._0_8_ = local_890;
      auVar4._8_8_ = 0x100000001;
      auVar4._0_8_ = 0x100000001;
      auVar4 = vpaddd_avx(auVar7,auVar4);
      auVar6._8_8_ = uStack_8a8;
      auVar6._0_8_ = local_8b0;
      auVar5._8_8_ = 0x100000001;
      auVar5._0_8_ = 0x100000001;
      auVar5 = vpaddd_avx(auVar6,auVar5);
      local_1130._0_8_ = auVar4._0_8_;
      local_770 = local_1130._0_8_;
      local_1130._8_8_ = auVar4._8_8_;
      uStack_768 = local_1130._8_8_;
      local_7a0 = 0xfffffffefffffffe;
      uStack_798 = 0xfffffffefffffffe;
      auVar37._8_8_ = 0xfffffffefffffffe;
      auVar37._0_8_ = 0xfffffffefffffffe;
      auVar4 = vpand_avx(auVar4,auVar37);
      local_1140._0_8_ = auVar5._0_8_;
      local_790 = local_1140._0_8_;
      local_1140._8_8_ = auVar5._8_8_;
      uStack_788 = local_1140._8_8_;
      auVar36._8_8_ = 0xfffffffefffffffe;
      auVar36._0_8_ = 0xfffffffefffffffe;
      auVar5 = vpand_avx(auVar5,auVar36);
      local_1130._0_8_ = auVar4._0_8_;
      local_1180 = local_1130._0_8_;
      local_1130._8_8_ = auVar4._8_8_;
      uStack_1178 = local_1130._8_8_;
      local_1140._0_8_ = auVar5._0_8_;
      uStack_1170 = local_1140._0_8_;
      local_1140._8_8_ = auVar5._8_8_;
      uStack_1168 = local_1140._8_8_;
      local_840 = local_1130._0_8_;
      uStack_838 = local_1130._8_8_;
      uStack_830 = local_1140._0_8_;
      uStack_828 = local_1140._8_8_;
      auVar71._16_8_ = local_1140._0_8_;
      auVar71._0_16_ = auVar4;
      auVar71._24_8_ = local_1140._8_8_;
      auVar3 = vcvtdq2ps_avx(auVar71);
      local_7b0 = local_1130._0_8_;
      uStack_7a8 = local_1130._8_8_;
      local_7e0 = 0x400000004;
      uStack_7d8 = 0x400000004;
      auVar35._8_8_ = 0x400000004;
      auVar35._0_8_ = 0x400000004;
      auVar6 = vpand_avx(auVar4,auVar35);
      local_7d0 = local_1140._0_8_;
      uStack_7c8 = local_1140._8_8_;
      auVar34._8_8_ = 0x400000004;
      auVar34._0_8_ = 0x400000004;
      auVar7 = vpand_avx(auVar5,auVar34);
      local_1110._0_8_ = auVar6._0_8_;
      local_850 = local_1110._0_8_;
      local_1110._8_8_ = auVar6._8_8_;
      uStack_848 = local_1110._8_8_;
      local_854 = 0x1d;
      local_1110 = vpslld_avx(auVar6,ZEXT416(0x1d));
      local_1120._0_8_ = auVar7._0_8_;
      local_870 = local_1120._0_8_;
      local_1120._8_8_ = auVar7._8_8_;
      uStack_868 = local_1120._8_8_;
      local_874 = 0x1d;
      local_1120 = vpslld_avx(auVar7,ZEXT416(0x1d));
      local_11a0 = local_1110._0_8_;
      uStack_1198 = local_1110._8_8_;
      uStack_1190 = local_1120._0_8_;
      uStack_1188 = local_1120._8_8_;
      local_10e0 = local_1110._0_8_;
      uStack_10d8 = local_1110._8_8_;
      uStack_10d0 = local_1120._0_8_;
      uStack_10c8 = local_1120._8_8_;
      local_7f0 = local_1130._0_8_;
      uStack_7e8 = local_1130._8_8_;
      local_820 = 0x200000002;
      uStack_818 = 0x200000002;
      auVar33._8_8_ = 0x200000002;
      auVar33._0_8_ = 0x200000002;
      auVar4 = vpand_avx(auVar4,auVar33);
      local_810 = local_1140._0_8_;
      uStack_808 = local_1140._8_8_;
      auVar8._8_8_ = 0x200000002;
      auVar8._0_8_ = 0x200000002;
      auVar5 = vpand_avx(auVar5,auVar8);
      local_1130._0_8_ = auVar4._0_8_;
      local_730 = local_1130._0_8_;
      local_1130._8_8_ = auVar4._8_8_;
      uStack_728 = local_1130._8_8_;
      local_720 = ZEXT816(0) << 0x20;
      local_740 = 0;
      local_710._8_8_ = SUB168(ZEXT816(0),4);
      uStack_738 = local_710._8_8_;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_710._8_8_;
      local_1130 = vpcmpeqd_avx(auVar4,auVar65 << 0x40);
      local_1140._0_8_ = auVar5._0_8_;
      local_750 = local_1140._0_8_;
      local_1140._8_8_ = auVar5._8_8_;
      uStack_748 = local_1140._8_8_;
      local_760 = 0;
      uStack_758 = local_710._8_8_;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_710._8_8_;
      local_1140 = vpcmpeqd_avx(auVar5,auVar66 << 0x40);
      local_11c0 = local_1130._0_8_;
      uStack_11b8 = local_1130._8_8_;
      uStack_11b0 = local_1140._0_8_;
      uStack_11a8 = local_1140._8_8_;
      local_1100 = local_1130._0_8_;
      uStack_10f8 = local_1130._8_8_;
      uStack_10f0 = local_1140._0_8_;
      uStack_10e8 = local_1140._8_8_;
      local_fe0 = local_1110._0_8_;
      uStack_fd8 = local_1110._8_8_;
      uStack_fd0 = local_1120._0_8_;
      uStack_fc8 = local_1120._8_8_;
      local_11e0 = local_1110._0_8_;
      uStack_11d8 = local_1110._8_8_;
      uStack_11d0 = local_1120._0_8_;
      uStack_11c8 = local_1120._8_8_;
      local_1000 = local_1130._0_8_;
      uStack_ff8 = local_1130._8_8_;
      uStack_ff0 = local_1140._0_8_;
      uStack_fe8 = local_1140._8_8_;
      local_1200 = local_1130._0_8_;
      uStack_11f8 = local_1130._8_8_;
      uStack_11f0 = local_1140._0_8_;
      uStack_11e8 = local_1140._8_8_;
      local_10a0 = auVar2._0_8_;
      uVar13 = local_10a0;
      uStack_1098 = auVar2._8_8_;
      uVar14 = uStack_1098;
      uStack_1090 = auVar2._16_8_;
      uVar15 = uStack_1090;
      uStack_1088 = auVar2._24_8_;
      uVar16 = uStack_1088;
      local_6a0._0_4_ = auVar2._0_4_;
      local_6a0._4_4_ = auVar2._4_4_;
      uStack_698._0_4_ = auVar2._8_4_;
      uStack_698._4_4_ = auVar2._12_4_;
      uStack_690._0_4_ = auVar2._16_4_;
      uStack_690._4_4_ = auVar2._20_4_;
      uStack_688._0_4_ = auVar2._24_4_;
      uStack_688._4_4_ = auVar2._28_4_;
      local_6c0._0_4_ = local_1110._0_4_;
      local_6c0._4_4_ = local_1110._4_4_;
      uStack_6b8._0_4_ = local_1110._8_4_;
      uStack_6b8._4_4_ = local_1110._12_4_;
      uStack_6b0._0_4_ = local_1120._0_4_;
      uStack_6b0._4_4_ = local_1120._4_4_;
      uStack_6a8._0_4_ = local_1120._8_4_;
      uStack_6a8._4_4_ = local_1120._12_4_;
      local_10a0 = CONCAT44(local_6a0._4_4_ ^ local_6c0._4_4_,(uint)local_6a0 ^ (uint)local_6c0);
      uStack_1098._0_4_ = (uint)uStack_698 ^ (uint)uStack_6b8;
      uStack_1098._4_4_ = uStack_698._4_4_ ^ uStack_6b8._4_4_;
      uStack_1090._0_4_ = (uint)uStack_690 ^ (uint)uStack_6b0;
      uStack_1090._4_4_ = uStack_690._4_4_ ^ uStack_6b0._4_4_;
      auVar69 = _local_10a0;
      uStack_1088._0_4_ = (uint)uStack_688 ^ (uint)uStack_6a8;
      uStack_1088._4_4_ = uStack_688._4_4_ ^ uStack_6a8._4_4_;
      auVar27 = _local_10a0;
      local_1040 = 0xbf490000bf490000;
      uStack_1038 = 0xbf490000bf490000;
      uStack_1030 = 0xbf490000bf490000;
      uStack_1028 = 0xbf490000bf490000;
      local_1060 = 0xb97da000b97da000;
      uStack_1058 = 0xb97da000b97da000;
      uStack_1050 = 0xb97da000b97da000;
      uStack_1048 = 0xb97da000b97da000;
      local_d40 = local_10c0;
      local_ce8 = &local_1040;
      local_d98 = local_1020;
      local_10c0 = auVar3._0_8_;
      local_be0 = local_10c0;
      uStack_10b8 = auVar3._8_8_;
      uStack_bd8 = uStack_10b8;
      uStack_10b0 = auVar3._16_8_;
      uStack_bd0 = uStack_10b0;
      uStack_10a8 = auVar3._24_8_;
      uStack_bc8 = uStack_10a8;
      local_c00 = 0xbf490000bf490000;
      uStack_bf8 = 0xbf490000bf490000;
      uStack_bf0 = 0xbf490000bf490000;
      uStack_be8 = 0xbf490000bf490000;
      auVar56._8_8_ = 0xbf490000bf490000;
      auVar56._0_8_ = 0xbf490000bf490000;
      auVar56._16_8_ = 0xbf490000bf490000;
      auVar56._24_8_ = 0xbf490000bf490000;
      local_c20 = local_1020._0_8_;
      uStack_c18 = local_1020._8_8_;
      uStack_c10 = local_1020._16_8_;
      uStack_c08 = local_1020._24_8_;
      auVar4 = vfmadd213ps_fma(auVar56,auVar3,auVar1);
      local_d00 = &local_1060;
      local_b80 = local_10c0;
      uStack_b78 = uStack_10b8;
      uStack_b70 = uStack_10b0;
      uStack_b68 = uStack_10a8;
      local_ba0 = 0xb97da000b97da000;
      uStack_b98 = 0xb97da000b97da000;
      uStack_b90 = 0xb97da000b97da000;
      uStack_b88 = 0xb97da000b97da000;
      auVar55._8_8_ = 0xb97da000b97da000;
      auVar55._0_8_ = 0xb97da000b97da000;
      auVar55._16_8_ = 0xb97da000b97da000;
      auVar55._24_8_ = 0xb97da000b97da000;
      local_1020._0_8_ = auVar4._0_8_;
      local_bc0 = local_1020._0_8_;
      local_1020._8_8_ = auVar4._8_8_;
      uStack_bb8 = local_1020._8_8_;
      uStack_bb0 = 0;
      uStack_ba8 = 0;
      auVar4 = vfmadd213ps_fma(auVar55,auVar3,ZEXT1632(auVar4));
      local_d18 = &local_1080;
      local_b20 = local_10c0;
      uStack_b18 = uStack_10b8;
      uStack_b10 = uStack_10b0;
      uStack_b08 = uStack_10a8;
      local_b40 = 0xb3222169b3222169;
      uStack_b38 = 0xb3222169b3222169;
      uStack_b30 = 0xb3222169b3222169;
      uStack_b28 = 0xb3222169b3222169;
      auVar54._8_8_ = 0xb3222169b3222169;
      auVar54._0_8_ = 0xb3222169b3222169;
      auVar54._16_8_ = 0xb3222169b3222169;
      auVar54._24_8_ = 0xb3222169b3222169;
      local_1020._0_8_ = auVar4._0_8_;
      local_b60 = local_1020._0_8_;
      local_1020._8_8_ = auVar4._8_8_;
      uStack_b58 = local_1020._8_8_;
      uStack_b50 = 0;
      uStack_b48 = 0;
      auVar4 = vfmadd213ps_fma(auVar54,auVar3,ZEXT1632(auVar4));
      auVar71 = ZEXT1632(auVar4);
      uStack_10b8 = 0x37ccf5ce37ccf5ce;
      local_10c0 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      uStack_10b0 = 0x37ccf5ce37ccf5ce;
      uStack_10a8 = 0x37ccf5ce37ccf5ce;
      local_1020._0_8_ = auVar4._0_8_;
      local_e20 = local_1020._0_8_;
      local_1020._8_8_ = auVar4._8_8_;
      uStack_e18 = local_1020._8_8_;
      uStack_e10 = 0;
      uStack_e08 = 0;
      local_e00._0_4_ = auVar4._0_4_;
      local_e00._4_4_ = auVar4._4_4_;
      uStack_df8._0_4_ = auVar4._8_4_;
      uStack_df8._4_4_ = auVar4._12_4_;
      uStack_1204 = 0;
      local_1220 = (float)local_e00 * (float)local_e00;
      fStack_121c = local_e00._4_4_ * local_e00._4_4_;
      fStack_1218 = (float)uStack_df8 * (float)uStack_df8;
      fStack_1214 = uStack_df8._4_4_ * uStack_df8._4_4_;
      uStack_1210 = 0;
      uStack_120c = 0;
      uStack_1208 = 0;
      local_d78 = &local_1220;
      local_d38 = _ps256_coscof_p1;
      local_ac0 = 0x37ccf5ce37ccf5ce;
      uStack_ab8 = 0x37ccf5ce37ccf5ce;
      uStack_ab0 = 0x37ccf5ce37ccf5ce;
      uStack_aa8 = 0x37ccf5ce37ccf5ce;
      local_ae0 = CONCAT44(fStack_121c,local_1220);
      uStack_ad8 = CONCAT44(fStack_1214,fStack_1218);
      uStack_ad0 = 0;
      uStack_ac8 = 0;
      local_b00[0] = -0.0013887316;
      local_b00[1] = -0.0013887316;
      afStack_af8[0] = -0.0013887316;
      afStack_af8[1] = -0.0013887316;
      afStack_af0[0] = -0.0013887316;
      afStack_af0[1] = -0.0013887316;
      afStack_ae8[0] = -0.0013887316;
      afStack_ae8[1] = -0.0013887316;
      auVar28._8_4_ = -0.0013887316;
      auVar28._12_4_ = -0.0013887316;
      auVar28._0_4_ = -0.0013887316;
      auVar28._4_4_ = -0.0013887316;
      auVar28._16_4_ = -0.0013887316;
      auVar28._20_4_ = -0.0013887316;
      auVar28._24_4_ = -0.0013887316;
      auVar28._28_4_ = -0.0013887316;
      auVar4 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1214,
                                                  CONCAT48(fStack_1218,
                                                           CONCAT44(fStack_121c,local_1220)))),
                               _local_10c0,auVar28);
      local_d50 = _ps256_coscof_p2;
      local_10c0 = auVar4._0_8_;
      local_a60 = local_10c0;
      uStack_10b8 = auVar4._8_8_;
      uStack_a58 = uStack_10b8;
      uStack_a50 = 0;
      uStack_a48 = 0;
      local_a80 = CONCAT44(fStack_121c,local_1220);
      uStack_a78 = CONCAT44(fStack_1214,fStack_1218);
      uStack_a70 = 0;
      uStack_a68 = 0;
      local_aa0[0] = 0.041666646;
      local_aa0[1] = 0.041666646;
      afStack_a98[0] = 0.041666646;
      afStack_a98[1] = 0.041666646;
      afStack_a90[0] = 0.041666646;
      afStack_a90[1] = 0.041666646;
      afStack_a88[0] = 0.041666646;
      afStack_a88[1] = 0.041666646;
      auVar29._8_4_ = 0.041666646;
      auVar29._12_4_ = 0.041666646;
      auVar29._0_4_ = 0.041666646;
      auVar29._4_4_ = 0.041666646;
      auVar29._16_4_ = 0.041666646;
      auVar29._20_4_ = 0.041666646;
      auVar29._24_4_ = 0.041666646;
      auVar29._28_4_ = 0.041666646;
      auVar4 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1214,
                                                  CONCAT48(fStack_1218,
                                                           CONCAT44(fStack_121c,local_1220)))),
                               ZEXT1632(auVar4),auVar29);
      local_10c0 = auVar4._0_8_;
      uVar17 = local_10c0;
      uStack_10b8 = auVar4._8_8_;
      uVar18 = uStack_10b8;
      uStack_e30 = 0;
      uStack_e28 = 0;
      local_e60 = CONCAT44(fStack_121c,local_1220);
      uStack_e58 = CONCAT44(fStack_1214,fStack_1218);
      uStack_e50 = 0;
      uStack_e48 = 0;
      local_e40._0_4_ = auVar4._0_4_;
      local_e40._4_4_ = auVar4._4_4_;
      uStack_e38._0_4_ = auVar4._8_4_;
      uStack_e38._4_4_ = auVar4._12_4_;
      local_10c0._4_4_ = local_e40._4_4_ * fStack_121c;
      local_10c0._0_4_ = (float)local_e40 * local_1220;
      uStack_10b8._0_4_ = (float)uStack_e38 * fStack_1218;
      uStack_10b8._4_4_ = uStack_e38._4_4_ * fStack_1214;
      local_e80 = local_10c0;
      uStack_e78 = uStack_10b8;
      uStack_e70 = 0;
      uStack_e68 = 0;
      local_ea0 = CONCAT44(fStack_121c,local_1220);
      uStack_e98 = CONCAT44(fStack_1214,fStack_1218);
      uStack_e90 = 0;
      uStack_e88 = 0;
      local_10c0._4_4_ = local_e40._4_4_ * fStack_121c * fStack_121c;
      local_10c0._0_4_ = (float)local_e40 * local_1220 * local_1220;
      local_920 = local_10c0;
      uStack_10b8._0_4_ = (float)uStack_e38 * fStack_1218 * fStack_1218;
      uStack_10b8._4_4_ = uStack_e38._4_4_ * fStack_1214 * fStack_1214;
      auVar4 = _local_10c0;
      _local_10c0 = ZEXT1632(_local_10c0);
      auVar1 = _local_10c0;
      local_cd0 = ::_ps256_0p5;
      local_8e0 = CONCAT44(fStack_121c,local_1220);
      uStack_8d8 = CONCAT44(fStack_1214,fStack_1218);
      uStack_8d0 = 0;
      uStack_8c8 = 0;
      local_900[0] = 0.5;
      local_900[1] = 0.5;
      afStack_8f8[0] = 0.5;
      afStack_8f8[1] = 0.5;
      afStack_8f0[0] = 0.5;
      afStack_8f0[1] = 0.5;
      afStack_8e8[0] = 0.5;
      afStack_8e8[1] = 0.5;
      uStack_10b8 = auVar4._8_8_;
      uStack_918 = uStack_10b8;
      uStack_910 = 0;
      uStack_908 = 0;
      auVar32._8_4_ = 0.5;
      auVar32._12_4_ = 0.5;
      auVar32._0_4_ = 0.5;
      auVar32._4_4_ = 0.5;
      auVar32._16_4_ = 0.5;
      auVar32._20_4_ = 0.5;
      auVar32._24_4_ = 0.5;
      auVar32._28_4_ = 0.5;
      auVar4 = vfnmadd213ps_fma(auVar32,ZEXT1632(CONCAT412(fStack_1214,
                                                           CONCAT48(fStack_1218,
                                                                    CONCAT44(fStack_121c,local_1220)
                                                                   ))),auVar1);
      local_10c0 = auVar4._0_8_;
      uVar19 = local_10c0;
      uStack_10b8 = auVar4._8_8_;
      uVar20 = uStack_10b8;
      uStack_c50 = 0;
      uStack_c48 = 0;
      local_c80 = 0x3f8000003f800000;
      uStack_c78 = 0x3f8000003f800000;
      uStack_c70 = 0x3f8000003f800000;
      uStack_c68 = 0x3f8000003f800000;
      local_c60._0_4_ = auVar4._0_4_;
      local_c60._4_4_ = auVar4._4_4_;
      uStack_c58._0_4_ = auVar4._8_4_;
      uStack_c58._4_4_ = auVar4._12_4_;
      local_10c0._4_4_ = local_c60._4_4_ + 1.0;
      local_10c0._0_4_ = (float)local_c60 + 1.0;
      uStack_10b8._0_4_ = (float)uStack_c58 + 1.0;
      uStack_10b8._4_4_ = uStack_c58._4_4_ + 1.0;
      uStack_10b0._0_4_ = 0x3f800000;
      uStack_10b0._4_4_ = 0x3f800000;
      auVar68 = _local_10c0;
      uStack_10a8._0_4_ = 0x3f800000;
      uStack_10a8._4_4_ = 0x3f800000;
      auVar3 = _local_10c0;
      uStack_1238 = 0xb94ca1f9b94ca1f9;
      local_1240 = (undefined1  [8])0xb94ca1f9b94ca1f9;
      uStack_1230 = 0xb94ca1f9b94ca1f9;
      uStack_1228 = 0xb94ca1f9b94ca1f9;
      local_d88 = local_1240;
      local_d68 = _ps256_sincof_p1;
      local_a00 = 0xb94ca1f9b94ca1f9;
      uStack_9f8 = 0xb94ca1f9b94ca1f9;
      uStack_9f0 = 0xb94ca1f9b94ca1f9;
      uStack_9e8 = 0xb94ca1f9b94ca1f9;
      local_a20 = CONCAT44(fStack_121c,local_1220);
      uStack_a18 = CONCAT44(fStack_1214,fStack_1218);
      uStack_a10 = 0;
      uStack_a08 = 0;
      local_a40[0] = 0.008332161;
      local_a40[1] = 0.008332161;
      afStack_a38[0] = 0.008332161;
      afStack_a38[1] = 0.008332161;
      afStack_a30[0] = 0.008332161;
      afStack_a30[1] = 0.008332161;
      afStack_a28[0] = 0.008332161;
      afStack_a28[1] = 0.008332161;
      auVar30._8_4_ = 0.008332161;
      auVar30._12_4_ = 0.008332161;
      auVar30._0_4_ = 0.008332161;
      auVar30._4_4_ = 0.008332161;
      auVar30._16_4_ = 0.008332161;
      auVar30._20_4_ = 0.008332161;
      auVar30._24_4_ = 0.008332161;
      auVar30._28_4_ = 0.008332161;
      auVar4 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1214,
                                                  CONCAT48(fStack_1218,
                                                           CONCAT44(fStack_121c,local_1220)))),
                               _local_1240,auVar30);
      local_d80 = _ps256_sincof_p2;
      local_1240 = auVar4._0_8_;
      local_9a0 = local_1240;
      uStack_1238 = auVar4._8_8_;
      uStack_998 = uStack_1238;
      uStack_990 = 0;
      uStack_988 = 0;
      local_9c0 = CONCAT44(fStack_121c,local_1220);
      uStack_9b8 = CONCAT44(fStack_1214,fStack_1218);
      uStack_9b0 = 0;
      uStack_9a8 = 0;
      local_9e0[0] = -0.16666655;
      local_9e0[1] = -0.16666655;
      afStack_9d8[0] = -0.16666655;
      afStack_9d8[1] = -0.16666655;
      afStack_9d0[0] = -0.16666655;
      afStack_9d0[1] = -0.16666655;
      afStack_9c8[0] = -0.16666655;
      afStack_9c8[1] = -0.16666655;
      auVar31._8_4_ = -0.16666655;
      auVar31._12_4_ = -0.16666655;
      auVar31._0_4_ = -0.16666655;
      auVar31._4_4_ = -0.16666655;
      auVar31._16_4_ = -0.16666655;
      auVar31._20_4_ = -0.16666655;
      auVar31._24_4_ = -0.16666655;
      auVar31._28_4_ = -0.16666655;
      auVar4 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1214,
                                                  CONCAT48(fStack_1218,
                                                           CONCAT44(fStack_121c,local_1220)))),
                               ZEXT1632(auVar4),auVar31);
      local_1240 = auVar4._0_8_;
      uVar21 = local_1240;
      uStack_1238 = auVar4._8_8_;
      uVar22 = uStack_1238;
      uStack_eb0 = 0;
      uStack_ea8 = 0;
      local_ee0 = CONCAT44(fStack_121c,local_1220);
      uStack_ed8 = CONCAT44(fStack_1214,fStack_1218);
      uStack_ed0 = 0;
      uStack_ec8 = 0;
      local_ec0._0_4_ = auVar4._0_4_;
      local_ec0._4_4_ = auVar4._4_4_;
      uStack_eb8._0_4_ = auVar4._8_4_;
      uStack_eb8._4_4_ = auVar4._12_4_;
      local_1240._4_4_ = local_ec0._4_4_ * fStack_121c;
      local_1240._0_4_ = (float)local_ec0 * local_1220;
      local_940 = local_1240;
      uStack_1238._0_4_ = (float)uStack_eb8 * fStack_1218;
      uStack_1238._4_4_ = uStack_eb8._4_4_ * fStack_1214;
      auVar4 = _local_1240;
      _local_1240 = ZEXT1632(_local_1240);
      auVar1 = _local_1240;
      uStack_1238 = auVar4._8_8_;
      uStack_938 = uStack_1238;
      uStack_930 = 0;
      uStack_928 = 0;
      local_960 = local_1020._0_8_;
      uStack_958 = local_1020._8_8_;
      uStack_950 = 0;
      uStack_948 = 0;
      local_980 = local_1020._0_8_;
      uStack_978 = local_1020._8_8_;
      uStack_970 = 0;
      uStack_968 = 0;
      auVar4 = vfmadd213ps_fma(auVar71,auVar1,auVar71);
      local_1080 = local_1130._0_8_;
      uStack_1078 = local_1130._8_8_;
      uStack_1070 = local_1140._0_8_;
      uStack_1068 = local_1140._8_8_;
      local_fa0 = local_1130._0_8_;
      uStack_f98 = local_1130._8_8_;
      uStack_f90 = local_1140._0_8_;
      uStack_f88 = local_1140._8_8_;
      local_1240 = auVar4._0_8_;
      local_fc0 = local_1240;
      uStack_1238 = auVar4._8_8_;
      uStack_fb8 = uStack_1238;
      uStack_fb0 = 0;
      uStack_fa8 = 0;
      auVar2._16_8_ = local_1140._0_8_;
      auVar2._0_16_ = local_1130;
      auVar2._24_8_ = local_1140._8_8_;
      _local_1240 = vandps_avx(auVar2,ZEXT1632(auVar4));
      local_680 = local_10c0;
      uStack_678 = uStack_10b8;
      uStack_10b0 = auVar68._16_8_;
      uStack_670 = uStack_10b0;
      uStack_10a8 = auVar3._24_8_;
      uStack_668 = uStack_10a8;
      local_660._0_4_ = local_1130._0_4_;
      local_660._4_4_ = local_1130._4_4_;
      uStack_658._0_4_ = local_1130._8_4_;
      uStack_658._4_4_ = local_1130._12_4_;
      uStack_650._0_4_ = local_1140._0_4_;
      uStack_650._4_4_ = local_1140._4_4_;
      uStack_648._0_4_ = local_1140._8_4_;
      uStack_648._4_4_ = local_1140._12_4_;
      auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar72._0_4_ = (uint)local_660 ^ auVar1._0_4_;
      auVar72._4_4_ = local_660._4_4_ ^ auVar1._4_4_;
      auVar72._8_4_ = (uint)uStack_658 ^ auVar1._8_4_;
      auVar72._12_4_ = uStack_658._4_4_ ^ auVar1._12_4_;
      auVar72._16_4_ = (uint)uStack_650 ^ auVar1._16_4_;
      auVar72._20_4_ = uStack_650._4_4_ ^ auVar1._20_4_;
      auVar72._24_4_ = (uint)uStack_648 ^ auVar1._24_4_;
      auVar72._28_4_ = uStack_648._4_4_ ^ auVar1._28_4_;
      auVar38._16_8_ = uStack_10b0;
      auVar38._0_16_ = _local_10c0;
      auVar38._24_8_ = uStack_10a8;
      auVar1 = vandps_avx(auVar72,auVar38);
      local_10c0 = auVar1._0_8_;
      uVar23 = local_10c0;
      uStack_10b8 = auVar1._8_8_;
      uVar24 = uStack_10b8;
      uStack_10b0 = auVar1._16_8_;
      uVar25 = uStack_10b0;
      uStack_10a8 = auVar1._24_8_;
      uVar26 = uStack_10a8;
      local_ca0._0_4_ = auVar1._0_4_;
      local_ca0._4_4_ = auVar1._4_4_;
      uStack_c98._0_4_ = auVar1._8_4_;
      uStack_c98._4_4_ = auVar1._12_4_;
      uStack_c90._0_4_ = auVar1._16_4_;
      uStack_c90._4_4_ = auVar1._20_4_;
      uStack_c88._0_4_ = auVar1._24_4_;
      uStack_c88._4_4_ = auVar1._28_4_;
      local_cc0._0_4_ = local_1240._0_4_;
      local_cc0._4_4_ = local_1240._4_4_;
      uStack_cb8._0_4_ = local_1240._8_4_;
      uStack_cb8._4_4_ = local_1240._12_4_;
      uStack_cb0._0_4_ = local_1240._16_4_;
      uStack_cb0._4_4_ = local_1240._20_4_;
      uStack_ca8._0_4_ = local_1240._24_4_;
      uStack_ca8._4_4_ = local_1240._28_4_;
      local_10c0._4_4_ = local_ca0._4_4_ + local_cc0._4_4_;
      local_10c0._0_4_ = (float)local_ca0 + (float)local_cc0;
      uStack_10b8._0_4_ = (float)uStack_c98 + (float)uStack_cb8;
      uStack_10b8._4_4_ = uStack_c98._4_4_ + uStack_cb8._4_4_;
      uStack_10b0._0_4_ = (float)uStack_c90 + (float)uStack_cb0;
      uStack_10b0._4_4_ = uStack_c90._4_4_ + uStack_cb0._4_4_;
      auVar68 = _local_10c0;
      uStack_10a8._0_4_ = (float)uStack_c88 + (float)uStack_ca8;
      uStack_10a8._4_4_ = uStack_c88._4_4_ + uStack_ca8._4_4_;
      auVar1 = _local_10c0;
      local_6e0 = local_10c0;
      uStack_6d8 = uStack_10b8;
      uStack_10b0 = auVar68._16_8_;
      uStack_6d0 = uStack_10b0;
      uStack_10a8 = auVar1._24_8_;
      uStack_6c8 = uStack_10a8;
      local_700 = local_10a0;
      uStack_6f8 = uStack_1098;
      uStack_1090 = auVar69._16_8_;
      uStack_6f0 = uStack_1090;
      uStack_1088 = auVar27._24_8_;
      uStack_6e8 = uStack_1088;
      local_10c0._4_4_ =
           (uint)(local_ca0._4_4_ + local_cc0._4_4_) ^ local_6a0._4_4_ ^ local_6c0._4_4_;
      local_10c0._0_4_ =
           (uint)((float)local_ca0 + (float)local_cc0) ^ (uint)local_6a0 ^ (uint)local_6c0;
      uStack_10b8._0_4_ =
           (uint)((float)uStack_c98 + (float)uStack_cb8) ^ (uint)uStack_698 ^ (uint)uStack_6b8;
      uStack_10b8._4_4_ =
           (uint)(uStack_c98._4_4_ + uStack_cb8._4_4_) ^ uStack_698._4_4_ ^ uStack_6b8._4_4_;
      uStack_10b0._0_4_ =
           (uint)((float)uStack_c90 + (float)uStack_cb0) ^ (uint)uStack_690 ^ (uint)uStack_6b0;
      uStack_10b0._4_4_ =
           (uint)(uStack_c90._4_4_ + uStack_cb0._4_4_) ^ uStack_690._4_4_ ^ uStack_6b0._4_4_;
      auVar68 = _local_10c0;
      uStack_10a8._0_4_ =
           (uint)((float)uStack_c88 + (float)uStack_ca8) ^ (uint)uStack_688 ^ (uint)uStack_6a8;
      uStack_10a8._4_4_ =
           (uint)(uStack_c88._4_4_ + uStack_ca8._4_4_) ^ uStack_688._4_4_ ^ uStack_6a8._4_4_;
      auVar2 = _local_10c0;
      local_1420 = local_10c0;
      uStack_1418 = uStack_10b8;
      uStack_10b0 = auVar68._16_8_;
      uStack_1410 = uStack_10b0;
      uStack_10a8 = auVar2._24_8_;
      uStack_1408 = uStack_10a8;
      local_1310 = local_13b0;
      local_1340 = local_10c0;
      uStack_1338 = uStack_10b8;
      uStack_1330 = uStack_10b0;
      uStack_1328 = uStack_10a8;
      auVar1._16_8_ = uStack_10b0;
      auVar1._0_16_ = _local_10c0;
      auVar1._24_8_ = uStack_10a8;
      *local_13b0 = auVar1;
      local_13b0 = local_13b0 + 1;
      _local_10c0 = auVar2;
      _local_10a0 = auVar27;
      local_1020 = auVar71;
      uStack_f10 = uStack_f50;
      uStack_f08 = uStack_f48;
      local_ec0 = uVar21;
      uStack_eb8 = uVar22;
      local_e40 = uVar17;
      uStack_e38 = uVar18;
      local_e00 = local_e20;
      uStack_df8 = uStack_e18;
      uStack_df0 = uStack_e10;
      uStack_de8 = uStack_e08;
      local_dc0 = uVar9;
      uStack_db8 = uVar10;
      uStack_db0 = uVar11;
      uStack_da8 = uVar12;
      local_d90 = local_d98;
      local_d70 = local_d88;
      local_d60 = local_d78;
      local_d58 = local_d88;
      local_d48 = local_d78;
      local_d30 = local_d78;
      local_d28 = local_d40;
      local_d20 = local_d98;
      local_d10 = local_d40;
      local_d08 = local_d98;
      local_cf8 = local_d40;
      local_cf0 = local_d98;
      local_ce0 = local_d40;
      local_cd8 = local_d40;
      local_cc8 = local_d78;
      local_cc0 = local_1240;
      uStack_cb8 = uStack_1238;
      uStack_cb0 = uStack_1230;
      uStack_ca8 = uStack_1228;
      local_ca0 = uVar23;
      uStack_c98 = uVar24;
      uStack_c90 = uVar25;
      uStack_c88 = uVar26;
      local_c60 = uVar19;
      uStack_c58 = uVar20;
      local_8a0 = local_8c0;
      uStack_898 = uStack_8b8;
      local_800 = local_820;
      uStack_7f8 = uStack_818;
      local_7c0 = local_7e0;
      uStack_7b8 = uStack_7d8;
      local_780 = local_7a0;
      uStack_778 = uStack_798;
      local_710 = local_720;
      local_6c0 = local_1110._0_8_;
      uStack_6b8 = local_1110._8_8_;
      uStack_6b0 = local_1120._0_8_;
      uStack_6a8 = local_1120._8_8_;
      local_6a0 = uVar13;
      uStack_698 = uVar14;
      uStack_690 = uVar15;
      uStack_688 = uVar16;
      local_660 = local_1130._0_8_;
      uStack_658 = local_1130._8_8_;
      uStack_650 = local_1140._0_8_;
      uStack_648 = local_1140._8_8_;
    }
    for (; local_1298 = local_1350, local_13d8 = local_12e8, local_13fc + 3 < local_13a4;
        local_13fc = local_13fc + 4) {
      local_1308 = local_13b0;
      local_530 = *(undefined8 *)*local_13b0;
      uStack_528 = *(undefined8 *)(*local_13b0 + 8);
      local_1258 = local_1389;
      local_1260 = &local_1430;
      local_500 = ZEXT816(0) << 0x20;
      local_520 = 0x7fffffff7fffffff;
      uStack_518 = 0x7fffffff7fffffff;
      auVar40._8_8_ = 0x7fffffff7fffffff;
      auVar40._0_8_ = 0x7fffffff7fffffff;
      auVar5 = vpand_avx(*(undefined1 (*) [16])*local_13b0,auVar40);
      local_540 = 0x8000000080000000;
      uStack_538 = 0x8000000080000000;
      auVar39._8_8_ = 0x8000000080000000;
      auVar39._0_8_ = 0x8000000080000000;
      auVar6 = vpand_avx(*(undefined1 (*) [16])*local_13b0,auVar39);
      local_590._0_8_ = auVar5._0_8_;
      uVar9 = local_590._0_8_;
      local_590._8_8_ = auVar5._8_8_;
      uVar10 = local_590._8_8_;
      local_470 = 0x3fa2f9833fa2f983;
      uStack_468 = 0x3fa2f9833fa2f983;
      local_460._0_4_ = auVar5._0_4_;
      local_460._4_4_ = auVar5._4_4_;
      uStack_458._0_4_ = auVar5._8_4_;
      uStack_458._4_4_ = auVar5._12_4_;
      local_5e0._4_4_ = local_460._4_4_ * 1.2732395;
      local_5e0._0_4_ = (float)local_460 * 1.2732395;
      uStack_5d8._0_4_ = (float)uStack_458 * 1.2732395;
      uStack_5d8._4_4_ = uStack_458._4_4_ * 1.2732395;
      local_3d0 = local_5e0;
      uStack_3c8 = uStack_5d8;
      local_600._4_4_ = (int)(local_460._4_4_ * 1.2732395);
      local_600._0_4_ = (int)((float)local_460 * 1.2732395);
      local_600._8_4_ = (int)((float)uStack_458 * 1.2732395);
      local_600._12_4_ = (int)(uStack_458._4_4_ * 1.2732395);
      local_440 = local_600._0_8_;
      uStack_438 = local_600._8_8_;
      local_450 = 0x100000001;
      uStack_448 = 0x100000001;
      auVar42._8_8_ = local_600._8_8_;
      auVar42._0_8_ = local_600._0_8_;
      auVar41._8_8_ = 0x100000001;
      auVar41._0_8_ = 0x100000001;
      auVar4 = vpaddd_avx(auVar42,auVar41);
      local_600._0_8_ = auVar4._0_8_;
      local_d0 = local_600._0_8_;
      local_600._8_8_ = auVar4._8_8_;
      uStack_c8 = local_600._8_8_;
      local_e0 = 0xfffffffefffffffe;
      uStack_d8 = 0xfffffffefffffffe;
      auVar50._8_8_ = 0xfffffffefffffffe;
      auVar50._0_8_ = 0xfffffffefffffffe;
      auVar7 = vpand_avx(auVar4,auVar50);
      local_600._0_8_ = auVar7._0_8_;
      local_3c0 = local_600._0_8_;
      local_600._8_8_ = auVar7._8_8_;
      uStack_3b8 = local_600._8_8_;
      auVar4 = vcvtdq2ps_avx(auVar7);
      local_f0 = local_600._0_8_;
      uStack_e8 = local_600._8_8_;
      local_100 = 0x400000004;
      uStack_f8 = 0x400000004;
      auVar49._8_8_ = 0x400000004;
      auVar49._0_8_ = 0x400000004;
      auVar8 = vpand_avx(auVar7,auVar49);
      local_5f0._0_8_ = auVar8._0_8_;
      local_420 = local_5f0._0_8_;
      local_5f0._8_8_ = auVar8._8_8_;
      uStack_418 = local_5f0._8_8_;
      local_424 = 0x1d;
      local_5f0 = vpslld_avx(auVar8,ZEXT416(0x1d));
      local_110 = local_600._0_8_;
      uStack_108 = local_600._8_8_;
      local_120 = 0x200000002;
      uStack_118 = 0x200000002;
      auVar48._8_8_ = 0x200000002;
      auVar48._0_8_ = 0x200000002;
      auVar7 = vpand_avx(auVar7,auVar48);
      local_600._0_8_ = auVar7._0_8_;
      local_b0 = local_600._0_8_;
      local_600._8_8_ = auVar7._8_8_;
      uStack_a8 = local_600._8_8_;
      local_c0 = 0;
      local_a0._8_8_ = SUB168(ZEXT816(0),4);
      uStack_b8 = local_a0._8_8_;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_a0._8_8_;
      local_600 = vpcmpeqd_avx(auVar7,auVar67 << 0x40);
      local_570 = local_5f0._0_8_;
      uStack_568 = local_5f0._8_8_;
      local_610 = local_5f0._0_8_;
      uStack_608 = local_5f0._8_8_;
      local_580 = local_600._0_8_;
      uStack_578 = local_600._8_8_;
      local_620 = local_600._0_8_;
      uStack_618 = local_600._8_8_;
      local_5d0 = auVar6._0_8_;
      local_60 = local_5d0;
      uStack_5c8 = auVar6._8_8_;
      uStack_58 = uStack_5c8;
      local_70 = local_5f0._0_8_;
      uStack_68 = local_5f0._8_8_;
      local_90 = local_5d0 ^ local_5f0._0_8_;
      uStack_88 = uStack_5c8 ^ local_5f0._8_8_;
      uStack_5c8 = uStack_88;
      local_5d0 = local_90;
      local_5a0 = 0xbf490000bf490000;
      uStack_598 = 0xbf490000bf490000;
      local_5b0 = 0xb97da000b97da000;
      uStack_5a8 = 0xb97da000b97da000;
      local_3a8 = local_5e0;
      local_2e0 = &local_5a0;
      local_390 = local_590;
      local_5e0 = auVar4._0_8_;
      local_280 = local_5e0;
      uStack_5d8 = auVar4._8_8_;
      uStack_278 = uStack_5d8;
      local_290 = 0xbf490000bf490000;
      uStack_288 = 0xbf490000bf490000;
      auVar64._8_8_ = 0xbf490000bf490000;
      auVar64._0_8_ = 0xbf490000bf490000;
      local_2a0 = local_590._0_8_;
      uStack_298 = local_590._8_8_;
      auVar5 = vfmadd213ps_fma(auVar64,auVar4,auVar5);
      local_2f8 = &local_5b0;
      local_250 = local_5e0;
      uStack_248 = uStack_5d8;
      local_260 = 0xb97da000b97da000;
      uStack_258 = 0xb97da000b97da000;
      auVar63._8_8_ = 0xb97da000b97da000;
      auVar63._0_8_ = 0xb97da000b97da000;
      local_590._0_8_ = auVar5._0_8_;
      local_270 = local_590._0_8_;
      local_590._8_8_ = auVar5._8_8_;
      uStack_268 = local_590._8_8_;
      auVar5 = vfmadd213ps_fma(auVar63,auVar4,auVar5);
      local_310 = &local_5c0;
      local_220 = local_5e0;
      uStack_218 = uStack_5d8;
      local_230 = 0xb3222169b3222169;
      uStack_228 = 0xb3222169b3222169;
      auVar62._8_8_ = 0xb3222169b3222169;
      auVar62._0_8_ = 0xb3222169b3222169;
      local_590._0_8_ = auVar5._0_8_;
      local_240 = local_590._0_8_;
      local_590._8_8_ = auVar5._8_8_;
      uStack_238 = local_590._8_8_;
      local_590 = vfmadd213ps_fma(auVar62,auVar4,auVar5);
      uStack_5d8 = 0x37ccf5ce37ccf5ce;
      local_5e0 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      local_490 = local_590._0_8_;
      uStack_488 = local_590._8_8_;
      local_480._0_4_ = local_590._0_4_;
      local_480._4_4_ = local_590._4_4_;
      uStack_478._0_4_ = local_590._8_4_;
      uStack_478._4_4_ = local_590._12_4_;
      local_630 = (float)local_480 * (float)local_480;
      fStack_62c = local_480._4_4_ * local_480._4_4_;
      fStack_628 = (float)uStack_478 * (float)uStack_478;
      fStack_624 = uStack_478._4_4_ * uStack_478._4_4_;
      local_398 = &local_630;
      local_330 = _ps_coscof_p1;
      local_1f0 = 0x37ccf5ce37ccf5ce;
      uStack_1e8 = 0x37ccf5ce37ccf5ce;
      local_200 = CONCAT44(fStack_62c,local_630);
      uStack_1f8 = CONCAT44(fStack_624,fStack_628);
      auVar57._4_4_ = fStack_62c;
      auVar57._0_4_ = local_630;
      auVar57._8_4_ = fStack_628;
      auVar57._12_4_ = fStack_624;
      local_210[0] = -0.0013887316;
      local_210[1] = -0.0013887316;
      afStack_208[0] = -0.0013887316;
      afStack_208[1] = -0.0013887316;
      auVar44._8_4_ = -0.0013887316;
      auVar44._12_4_ = -0.0013887316;
      auVar44._0_4_ = -0.0013887316;
      auVar44._4_4_ = -0.0013887316;
      auVar4 = vfmadd213ps_fma(auVar57,_local_5e0,auVar44);
      local_348 = _ps_coscof_p2;
      local_5e0 = auVar4._0_8_;
      local_1c0 = local_5e0;
      uStack_5d8 = auVar4._8_8_;
      uStack_1b8 = uStack_5d8;
      local_1d0 = CONCAT44(fStack_62c,local_630);
      uStack_1c8 = CONCAT44(fStack_624,fStack_628);
      auVar58._4_4_ = fStack_62c;
      auVar58._0_4_ = local_630;
      auVar58._8_4_ = fStack_628;
      auVar58._12_4_ = fStack_624;
      local_1e0[0] = 0.041666646;
      local_1e0[1] = 0.041666646;
      afStack_1d8[0] = 0.041666646;
      afStack_1d8[1] = 0.041666646;
      auVar45._8_4_ = 0.041666646;
      auVar45._12_4_ = 0.041666646;
      auVar45._0_4_ = 0.041666646;
      auVar45._4_4_ = 0.041666646;
      auVar4 = vfmadd213ps_fma(auVar58,auVar4,auVar45);
      local_5e0 = auVar4._0_8_;
      uVar11 = local_5e0;
      uStack_5d8 = auVar4._8_8_;
      uVar12 = uStack_5d8;
      local_4b0 = CONCAT44(fStack_62c,local_630);
      uStack_4a8 = CONCAT44(fStack_624,fStack_628);
      local_4a0._0_4_ = auVar4._0_4_;
      local_4a0._4_4_ = auVar4._4_4_;
      uStack_498._0_4_ = auVar4._8_4_;
      uStack_498._4_4_ = auVar4._12_4_;
      local_5e0._4_4_ = local_4a0._4_4_ * fStack_62c;
      local_5e0._0_4_ = (float)local_4a0 * local_630;
      uStack_5d8._0_4_ = (float)uStack_498 * fStack_628;
      uStack_5d8._4_4_ = uStack_498._4_4_ * fStack_624;
      local_4c0 = local_5e0;
      uStack_4b8 = uStack_5d8;
      local_4d0 = CONCAT44(fStack_62c,local_630);
      uStack_4c8 = CONCAT44(fStack_624,fStack_628);
      local_5e0._4_4_ = local_4a0._4_4_ * fStack_62c * fStack_62c;
      local_5e0._0_4_ = (float)local_4a0 * local_630 * local_630;
      uStack_5d8._0_4_ = (float)uStack_498 * fStack_628 * fStack_628;
      uStack_5d8._4_4_ = uStack_498._4_4_ * fStack_624 * fStack_624;
      local_3a0 = ::_ps_0p5;
      local_2b0 = CONCAT44(fStack_62c,local_630);
      uStack_2a8 = CONCAT44(fStack_624,fStack_628);
      auVar59._4_4_ = fStack_62c;
      auVar59._0_4_ = local_630;
      auVar59._8_4_ = fStack_628;
      auVar59._12_4_ = fStack_624;
      local_2c0[0] = 0.5;
      local_2c0[1] = 0.5;
      afStack_2b8[0] = 0.5;
      afStack_2b8[1] = 0.5;
      local_2d0 = local_5e0;
      uStack_2c8 = uStack_5d8;
      auVar43._8_4_ = 0.5;
      auVar43._12_4_ = 0.5;
      auVar43._0_4_ = 0.5;
      auVar43._4_4_ = 0.5;
      auVar4 = vfnmadd213ps_fma(auVar43,auVar59,_local_5e0);
      local_5e0 = auVar4._0_8_;
      uVar13 = local_5e0;
      uStack_5d8 = auVar4._8_8_;
      uVar14 = uStack_5d8;
      local_3f0 = 0x3f8000003f800000;
      uStack_3e8 = 0x3f8000003f800000;
      local_3e0._0_4_ = auVar4._0_4_;
      local_3e0._4_4_ = auVar4._4_4_;
      uStack_3d8._0_4_ = auVar4._8_4_;
      uStack_3d8._4_4_ = auVar4._12_4_;
      local_5e0._4_4_ = local_3e0._4_4_ + 1.0;
      local_5e0._0_4_ = (float)local_3e0 + 1.0;
      uStack_5d8._0_4_ = (float)uStack_3d8 + 1.0;
      uStack_5d8._4_4_ = uStack_3d8._4_4_ + 1.0;
      uStack_638 = 0xb94ca1f9b94ca1f9;
      local_640 = (undefined1  [8])0xb94ca1f9b94ca1f9;
      local_380 = local_640;
      local_360 = _ps_sincof_p1;
      local_190 = 0xb94ca1f9b94ca1f9;
      uStack_188 = 0xb94ca1f9b94ca1f9;
      local_1a0 = CONCAT44(fStack_62c,local_630);
      uStack_198 = CONCAT44(fStack_624,fStack_628);
      auVar60._4_4_ = fStack_62c;
      auVar60._0_4_ = local_630;
      auVar60._8_4_ = fStack_628;
      auVar60._12_4_ = fStack_624;
      local_1b0[0] = 0.008332161;
      local_1b0[1] = 0.008332161;
      afStack_1a8[0] = 0.008332161;
      afStack_1a8[1] = 0.008332161;
      auVar46._8_4_ = 0.008332161;
      auVar46._12_4_ = 0.008332161;
      auVar46._0_4_ = 0.008332161;
      auVar46._4_4_ = 0.008332161;
      auVar4 = vfmadd213ps_fma(auVar60,_local_640,auVar46);
      local_378 = _ps_sincof_p2;
      local_640 = auVar4._0_8_;
      local_160 = local_640;
      uStack_638 = auVar4._8_8_;
      uStack_158 = uStack_638;
      local_170 = CONCAT44(fStack_62c,local_630);
      uStack_168 = CONCAT44(fStack_624,fStack_628);
      auVar61._4_4_ = fStack_62c;
      auVar61._0_4_ = local_630;
      auVar61._8_4_ = fStack_628;
      auVar61._12_4_ = fStack_624;
      local_180[0] = -0.16666655;
      local_180[1] = -0.16666655;
      afStack_178[0] = -0.16666655;
      afStack_178[1] = -0.16666655;
      auVar47._8_4_ = -0.16666655;
      auVar47._12_4_ = -0.16666655;
      auVar47._0_4_ = -0.16666655;
      auVar47._4_4_ = -0.16666655;
      auVar4 = vfmadd213ps_fma(auVar61,auVar4,auVar47);
      local_640 = auVar4._0_8_;
      uVar15 = local_640;
      uStack_638 = auVar4._8_8_;
      uVar16 = uStack_638;
      local_4f0 = CONCAT44(fStack_62c,local_630);
      uStack_4e8 = CONCAT44(fStack_624,fStack_628);
      local_4e0._0_4_ = auVar4._0_4_;
      local_4e0._4_4_ = auVar4._4_4_;
      uStack_4d8._0_4_ = auVar4._8_4_;
      uStack_4d8._4_4_ = auVar4._12_4_;
      local_640._4_4_ = local_4e0._4_4_ * fStack_62c;
      local_640._0_4_ = (float)local_4e0 * local_630;
      uStack_638._0_4_ = (float)uStack_4d8 * fStack_628;
      uStack_638._4_4_ = uStack_4d8._4_4_ * fStack_624;
      local_130 = local_640;
      uStack_128 = uStack_638;
      local_140 = local_590._0_8_;
      uStack_138 = local_590._8_8_;
      local_150 = local_590._0_8_;
      uStack_148 = local_590._8_8_;
      auVar4 = vfmadd213ps_fma(local_590,_local_640,local_590);
      local_5c0 = local_600._0_8_;
      uStack_5b8 = local_600._8_8_;
      local_550 = local_600._0_8_;
      uStack_548 = local_600._8_8_;
      local_640 = auVar4._0_8_;
      local_560 = local_640;
      uStack_638 = auVar4._8_8_;
      uStack_558 = uStack_638;
      _local_640 = vpand_avx(local_600,auVar4);
      local_50 = local_5e0;
      uStack_48 = uStack_5d8;
      auVar4 = vpcmpeqd_avx(local_600,local_600);
      auVar53._8_8_ = uStack_5d8;
      auVar53._0_8_ = local_5e0;
      auVar4 = vpand_avx(local_600 ^ auVar4,auVar53);
      local_5e0 = auVar4._0_8_;
      uVar17 = local_5e0;
      uStack_5d8 = auVar4._8_8_;
      uVar18 = uStack_5d8;
      local_400._0_4_ = auVar4._0_4_;
      local_400._4_4_ = auVar4._4_4_;
      uStack_3f8._0_4_ = auVar4._8_4_;
      uStack_3f8._4_4_ = auVar4._12_4_;
      local_410._0_4_ = local_640._0_4_;
      local_410._4_4_ = local_640._4_4_;
      uStack_408._0_4_ = local_640._8_4_;
      uStack_408._4_4_ = local_640._12_4_;
      local_5e0._4_4_ = local_400._4_4_ + local_410._4_4_;
      local_5e0._0_4_ = (float)local_400 + (float)local_410;
      uStack_5d8._0_4_ = (float)uStack_3f8 + (float)uStack_408;
      uStack_5d8._4_4_ = uStack_3f8._4_4_ + uStack_408._4_4_;
      local_80 = local_5e0;
      uStack_78 = uStack_5d8;
      auVar52._8_8_ = uStack_5d8;
      auVar52._0_8_ = local_5e0;
      auVar51._8_8_ = uStack_88;
      auVar51._0_8_ = local_90;
      _local_5e0 = auVar52 ^ auVar51;
      local_1430 = local_5e0;
      uStack_1428 = uStack_5d8;
      local_12f0 = local_13b0;
      local_1300 = local_5e0;
      uStack_12f8 = uStack_5d8;
      *(undefined1 (*) [16])*local_13b0 = _local_5e0;
      local_13b0 = (undefined1 (*) [32])(*local_13b0 + 0x10);
      local_510 = local_530;
      uStack_508 = uStack_528;
      local_4e0 = uVar15;
      uStack_4d8 = uVar16;
      local_4a0 = uVar11;
      uStack_498 = uVar12;
      local_480 = local_490;
      uStack_478 = uStack_488;
      local_460 = uVar9;
      uStack_458 = uVar10;
      local_410 = local_640;
      uStack_408 = uStack_638;
      local_400 = uVar17;
      uStack_3f8 = uVar18;
      local_3e0 = uVar13;
      uStack_3d8 = uVar14;
      local_388 = local_390;
      local_370 = local_398;
      local_368 = local_380;
      local_358 = local_398;
      local_350 = local_380;
      local_340 = local_398;
      local_338 = local_3a8;
      local_328 = local_398;
      local_320 = local_3a8;
      local_318 = local_390;
      local_308 = local_3a8;
      local_300 = local_390;
      local_2f0 = local_3a8;
      local_2e8 = local_390;
      local_2d8 = local_3a8;
      local_a0 = ZEXT816(0) << 0x20;
      local_40 = local_600;
    }
    for (; local_13fc < local_13a4; local_13fc = local_13fc + 1) {
      local_1248 = local_1389;
      local_1250 = local_13b0;
      fVar70 = sinf(*(float *)*local_13b0);
      *(float *)*local_13b0 = fVar70;
      local_13b0 = (undefined1 (*) [32])(*local_13b0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}